

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderSetV2fAttribute(ImfHeader *hdr,char *name,float x,float y)

{
  undefined1 uVar1;
  iterator this;
  TypedAttribute<Imath_3_2::Vec2<float>_> *this_00;
  Vec2<float> *this_01;
  ImfHeader *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  char *in_stack_00000040;
  Header *in_stack_00000048;
  exception *e;
  V2f v;
  Attribute *in_stack_00000520;
  char *in_stack_00000528;
  Header *in_stack_00000530;
  Header *in_stack_ffffffffffffff38;
  TypedAttribute<Imath_3_2::Vec2<float>_> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff68;
  Vec2<float> local_28 [3];
  ImfHeader *local_10;
  
  local_10 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(local_28,in_XMM0_Da,in_XMM1_Da);
  anon_unknown.dwarf_70604::header(local_10);
  Imf_3_4::Header::find(in_stack_00000048,in_stack_00000040);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff40,(Iterator *)in_stack_ffffffffffffff38);
  anon_unknown.dwarf_70604::header(local_10);
  this._M_node = (_Base_ptr)Imf_3_4::Header::end(in_stack_ffffffffffffff38);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff40,(Iterator *)in_stack_ffffffffffffff38);
  uVar1 = Imf_3_4::operator==((ConstIterator *)in_stack_ffffffffffffff40,
                              (ConstIterator *)in_stack_ffffffffffffff38);
  if ((bool)uVar1) {
    anon_unknown.dwarf_70604::header(local_10);
    Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>_>::TypedAttribute
              (in_stack_ffffffffffffff40,(Vec2<float> *)in_stack_ffffffffffffff38);
    Imf_3_4::Header::insert(in_stack_00000530,in_stack_00000528,in_stack_00000520);
    Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>_>::~TypedAttribute
              ((TypedAttribute<Imath_3_2::Vec2<float>_> *)0x19cb43);
  }
  else {
    anon_unknown.dwarf_70604::header(local_10);
    this_00 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>>
                        ((Header *)this._M_node,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff68));
    this_01 = Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>_>::value(this_00);
    Imath_3_2::Vec2<float>::operator=(this_01,local_28);
  }
  return 1;
}

Assistant:

int
ImfHeaderSetV2fAttribute (ImfHeader* hdr, const char name[], float x, float y)
{
    try
    {
        V2f v (x, y);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::V2fAttribute (v));
        else
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V2fAttribute> (
                    name)
                .value () = v;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}